

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

int32_t argv2int(jit_State *J,TValue *o)

{
  int iVar1;
  
  if (0xfffeffff < (o->field_2).it) {
    if ((o->field_2).it == 0xfffffffb) {
      iVar1 = lj_strscan_num((GCstr *)(ulong)(o->u32).lo,o);
      if (iVar1 != 0) goto LAB_00128ab3;
    }
    lj_trace_err(J,LJ_TRERR_BADTYPE);
  }
LAB_00128ab3:
  return (int)o->n;
}

Assistant:

static int32_t argv2int(jit_State *J, TValue *o)
{
  if (!lj_strscan_numberobj(o))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  return tvisint(o) ? intV(o) : lj_num2int(numV(o));
}